

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkP2PClientTest.cpp
# Opt level: O2

void __thiscall MyClientConnection::OnConnect(MyClientConnection *this)

{
  allocator local_5b9;
  string Hello;
  uint8_t hello [1401];
  
  test::LogTonkStatus(&this->super_SDKConnection);
  memset(hello,0,0x579);
  hello[0] = '\x05';
  std::__cxx11::string::string((string *)&Hello,"Hello World",&local_5b9);
  memcpy(hello + 1,Hello._M_dataplus._M_p,Hello._M_string_length + 1);
  test::FunctionTimer::BeginCall((FunctionTimer *)test::t_tonk_send);
  tonk::SDKConnection::Send(&this->super_SDKConnection,hello,Hello._M_string_length + 2,0x32);
  test::FunctionTimer::EndCall((FunctionTimer *)test::t_tonk_send);
  std::__cxx11::string::~string((string *)&Hello);
  return;
}

Assistant:

void MyClientConnection::OnConnect()
{
    LogTonkStatus(this);

    uint8_t hello[1 + 1400] = {};
    hello[0] = ID_ConnectionRebroadcast;
    std::string Hello = "Hello World";
    memcpy(hello + 1, Hello.c_str(), Hello.length() + 1);
    t_tonk_send.BeginCall();
    Send(hello, 1 + Hello.length() + 1, TonkChannel_Reliable0);
    t_tonk_send.EndCall();
}